

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

Char * Diligent::GetUsageString(USAGE Usage)

{
  int iVar1;
  char *pcVar2;
  string msg;
  string local_30;
  
  if (GetUsageString(Diligent::USAGE)::UsageStrings == '\0') {
    iVar1 = __cxa_guard_acquire(&GetUsageString(Diligent::USAGE)::UsageStrings);
    if (iVar1 != 0) {
      GetUsageString::UsageStrings.UsageStrings._M_elems[0] = "USAGE_IMMUTABLE";
      GetUsageString::UsageStrings.UsageStrings._M_elems[1] = "USAGE_DEFAULT";
      GetUsageString::UsageStrings.UsageStrings._M_elems[2] = "USAGE_DYNAMIC";
      GetUsageString::UsageStrings.UsageStrings._M_elems[3] = "USAGE_STAGING";
      GetUsageString::UsageStrings.UsageStrings._M_elems[4] = "USAGE_UNIFIED";
      GetUsageString::UsageStrings.UsageStrings._M_elems[5] = "USAGE_SPARSE";
      __cxa_guard_release(&GetUsageString(Diligent::USAGE)::UsageStrings);
    }
  }
  if (Usage < USAGE_NUM_USAGES) {
    pcVar2 = GetUsageString::UsageStrings.UsageStrings._M_elems[Usage];
  }
  else {
    pcVar2 = "Unknown usage";
    FormatString<char[14]>(&local_30,(char (*) [14])"Unknown usage");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x453);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return pcVar2;
}

Assistant:

const Char* GetUsageString(USAGE Usage)
{
    struct UsageToStringMap
    {
        UsageToStringMap()
        {
#define INIT_USAGE_STR(Usage) UsageStrings[Usage] = #Usage
            INIT_USAGE_STR(USAGE_IMMUTABLE);
            INIT_USAGE_STR(USAGE_DEFAULT);
            INIT_USAGE_STR(USAGE_DYNAMIC);
            INIT_USAGE_STR(USAGE_STAGING);
            INIT_USAGE_STR(USAGE_UNIFIED);
            INIT_USAGE_STR(USAGE_SPARSE);
#undef INIT_USAGE_STR
            static_assert(USAGE_NUM_USAGES == 6, "Please update the map to handle the new usage type");
        }

        const Char* operator[](USAGE Usage) const
        {
            if (Usage >= USAGE_IMMUTABLE && Usage < USAGE_NUM_USAGES)
                return UsageStrings[Usage];
            else
            {
                UNEXPECTED("Unknown usage");
                return "Unknown usage";
            }
        }

    private:
        std::array<const Char*, USAGE_NUM_USAGES> UsageStrings{};
    };

    static const UsageToStringMap UsageStrings;
    return UsageStrings[Usage];
}